

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_color.c
# Opt level: O1

void prf_vertex_with_color_fill_vertex(prf_node_t *node,prf_vertex_t *vertex)

{
  ushort uVar1;
  float64_t *pfVar2;
  bool bVar3;
  undefined8 uVar4;
  
  if (node->opcode != prf_vertex_with_color_info.opcode) {
    prf_error(9,"fill vertex with color from node of type %d");
    return;
  }
  uVar1 = node->length;
  uVar4 = 4;
  bVar3 = true;
  if (5 < uVar1) {
    pfVar2 = (float64_t *)node->data;
    vertex->color_name_index = *(uint16_t *)(pfVar2 + 3);
    uVar4 = 6;
    if (7 < uVar1) {
      vertex->flags = *(uint16_t *)((long)pfVar2 + 0x1a);
      uVar4 = 8;
      if (0xf < uVar1) {
        vertex->x = *pfVar2;
        uVar4 = 0x10;
        if (0x17 < uVar1) {
          vertex->y = pfVar2[1];
          uVar4 = 0x18;
          if (0x1f < uVar1) {
            vertex->z = pfVar2[2];
            uVar4 = 0x20;
            if (0x23 < uVar1) {
              vertex->packed_color = *(uint32_t *)((long)pfVar2 + 0x1c);
              if (uVar1 < 0x28) {
                uVar4 = 0x24;
              }
              else {
                vertex->color_index = *(uint32_t *)(pfVar2 + 4);
                uVar4 = 0x28;
              }
              bVar3 = false;
            }
          }
        }
      }
    }
  }
  if (bVar3) {
    prf_warn(1,"stores only %d bytes in vertex with color",uVar4);
  }
  if ((uint)uVar4 < (uint)node->length) {
    prf_warn(1,"vertex with color is larger than %d bytes (%d)",uVar4);
    return;
  }
  return;
}

Assistant:

void
prf_vertex_with_color_fill_vertex(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    int pos = 4;
    bool_t complete = FALSE;

    assert( node != NULL && vertex != NULL );

    if ( node->opcode != prf_vertex_with_color_info.opcode ) {
        prf_error( 9, "fill vertex with color from node of type %d",
            node->opcode );
        return;
    }

    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 2) ) break;
        vertex->color_name_index = data->color_name_index; pos += 2;
        if ( node->length < (pos + 2) ) break;
        vertex->flags = data->flags; pos += 2;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->x, data->x ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->y, data->y ); pos += 8;
        if ( node->length < (pos + 8) ) break;
        prf_dblcpy( vertex->z, data->z ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        vertex->packed_color = data->packed_color; pos += 4;
        complete = TRUE;
        if ( node->length < (pos + 4) ) break;
        vertex->color_index = data->color_index;  pos += 4;
        complete = TRUE;
    } while ( FALSE );

    if ( ! complete )
        prf_warn( 1, "stores only %d bytes in vertex with color", pos );
    /* padding can't be dealt with, but should be notified, though  */
    if ( pos < node->length )
        prf_warn( 1, "vertex with color is larger than %d bytes (%d)",
            pos, node->length );

}